

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

void __thiscall caffe::BlobProto::MergeFrom(BlobProto *this,BlobProto *from)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  LogMessage *pLVar4;
  BlobShape *pBVar5;
  LogFinisher local_139;
  LogMessage local_138;
  LogMessage local_100;
  LogMessage local_c8;
  LogMessage local_90;
  LogMessage local_58;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_100,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
               ,0xef3);
    pLVar4 = google::protobuf::internal::LogMessage::operator<<
                       (&local_100,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_138,pLVar4);
    google::protobuf::internal::LogMessage::~LogMessage(&local_100);
  }
  pvVar3 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe));
  }
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_c8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar4 = google::protobuf::internal::LogMessage::operator<<
                       (&local_c8,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_138,pLVar4);
    google::protobuf::internal::LogMessage::~LogMessage(&local_c8);
  }
  iVar1 = (from->data_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<float>::Reserve
              (&this->data_,iVar1 + (this->data_).current_size_);
    memcpy(((this->data_).rep_)->elements + (this->data_).current_size_,
           ((from->data_).rep_)->elements,(long)(from->data_).current_size_ << 2);
    (this->data_).current_size_ = (this->data_).current_size_ + (from->data_).current_size_;
  }
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar4 = google::protobuf::internal::LogMessage::operator<<
                       (&local_90,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_138,pLVar4);
    google::protobuf::internal::LogMessage::~LogMessage(&local_90);
  }
  iVar1 = (from->diff_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<float>::Reserve
              (&this->diff_,iVar1 + (this->diff_).current_size_);
    memcpy(((this->diff_).rep_)->elements + (this->diff_).current_size_,
           ((from->diff_).rep_)->elements,(long)(from->diff_).current_size_ << 2);
    (this->diff_).current_size_ = (this->diff_).current_size_ + (from->diff_).current_size_;
  }
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar4 = google::protobuf::internal::LogMessage::operator<<
                       (&local_58,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_138,pLVar4);
    google::protobuf::internal::LogMessage::~LogMessage(&local_58);
  }
  iVar1 = (from->double_data_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<double>::Reserve
              (&this->double_data_,iVar1 + (this->double_data_).current_size_);
    memcpy(((this->double_data_).rep_)->elements + (this->double_data_).current_size_,
           ((from->double_data_).rep_)->elements,(long)(from->double_data_).current_size_ << 3);
    (this->double_data_).current_size_ =
         (this->double_data_).current_size_ + (from->double_data_).current_size_;
  }
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_138,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar4 = google::protobuf::internal::LogMessage::operator<<
                       (&local_138,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_139,pLVar4);
    google::protobuf::internal::LogMessage::~LogMessage(&local_138);
  }
  iVar1 = (from->double_diff_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<double>::Reserve
              (&this->double_diff_,iVar1 + (this->double_diff_).current_size_);
    memcpy(((this->double_diff_).rep_)->elements + (this->double_diff_).current_size_,
           ((from->double_diff_).rep_)->elements,(long)(from->double_diff_).current_size_ << 3);
    (this->double_diff_).current_size_ =
         (this->double_diff_).current_size_ + (from->double_diff_).current_size_;
  }
  uVar2 = (from->_has_bits_).has_bits_[0];
  if ((uVar2 & 0x1f) != 0) {
    if ((uVar2 & 1) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      if (this->shape_ == (BlobShape *)0x0) {
        pBVar5 = (BlobShape *)operator_new(0x30);
        BlobShape::BlobShape(pBVar5);
        this->shape_ = pBVar5;
      }
      pBVar5 = from->shape_;
      if (pBVar5 == (BlobShape *)0x0) {
        pBVar5 = (BlobShape *)&_BlobShape_default_instance_;
      }
      BlobShape::MergeFrom(this->shape_,pBVar5);
    }
    if ((uVar2 & 2) != 0) {
      this->num_ = from->num_;
    }
    if ((uVar2 & 4) != 0) {
      this->channels_ = from->channels_;
    }
    if ((uVar2 & 8) != 0) {
      this->height_ = from->height_;
    }
    if ((uVar2 & 0x10) != 0) {
      this->width_ = from->width_;
    }
    (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar2;
  }
  return;
}

Assistant:

void BlobProto::MergeFrom(const BlobProto& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:caffe.BlobProto)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  data_.MergeFrom(from.data_);
  diff_.MergeFrom(from.diff_);
  double_data_.MergeFrom(from.double_data_);
  double_diff_.MergeFrom(from.double_diff_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 31u) {
    if (cached_has_bits & 0x00000001u) {
      mutable_shape()->::caffe::BlobShape::MergeFrom(from.shape());
    }
    if (cached_has_bits & 0x00000002u) {
      num_ = from.num_;
    }
    if (cached_has_bits & 0x00000004u) {
      channels_ = from.channels_;
    }
    if (cached_has_bits & 0x00000008u) {
      height_ = from.height_;
    }
    if (cached_has_bits & 0x00000010u) {
      width_ = from.width_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
}